

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# material.c
# Opt level: O3

prf_node_t * prf_material_node_create(prf_model_t *model,int index)

{
  int *piVar1;
  prf_node_t *ppVar2;
  
  ppVar2 = prf_node_create_etc(model,0x50);
  if (ppVar2 != (prf_node_t *)0x0) {
    ppVar2->opcode = 0x71;
    ppVar2->length = 0x54;
    piVar1 = (int *)ppVar2->data;
    *piVar1 = index;
    sprintf((char *)(piVar1 + 1),"prfmat_%d",index);
    piVar1[5] = 0x3e4ccccd;
    piVar1[6] = 0x3e4ccccd;
    piVar1[7] = 0x3e4ccccd;
    piVar1[8] = 0x3e4ccccd;
    piVar1[9] = 0x3e4ccccd;
    piVar1[10] = 0x3e4ccccd;
    piVar1[0xb] = 0;
    piVar1[0xc] = 0;
    piVar1[0xd] = 0;
    piVar1[0xe] = 0x3e4ccccd;
    piVar1[0xf] = 0x3e4ccccd;
    piVar1[0x10] = 0x3e4ccccd;
    piVar1[0x11] = 0x41a00000;
    piVar1[0x12] = 0x3f800000;
    piVar1[0x13] = 0;
  }
  return ppVar2;
}

Assistant:

prf_node_t *
prf_material_node_create(
  prf_model_t * model,
  int index )
{
  prf_node_t * node = prf_node_create_etc( model, 
					   sizeof( struct prf_material_data ) );
  if ( node ) {
    struct prf_material_data *data;
    node->opcode = 113;
    node->length = 4 + sizeof( struct prf_material_data );
    
    data = (struct prf_material_data *) node->data;

    data->material_index = index;
    sprintf( data->name, "prfmat_%d", index );
    data->ambient_red = 0.2f;
    data->ambient_green = 0.2f;
    data->ambient_blue = 0.2f;

    data->diffuse_red = 0.2f;
    data->diffuse_green = 0.2f;
    data->diffuse_blue = 0.2f;

    data->specular_red = 0.0f;
    data->specular_green = 0.0f;
    data->specular_blue = 0.0f;

    data->emissive_red = 0.2f;
    data->emissive_green = 0.2f;
    data->emissive_blue = 0.2f;

    data->shininess = 20.0f;
    data->alpha = 1.0f;
    data->spare = 0;
  }
  return node;
}